

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O1

int entry_cmp(void *p1,void *p2)

{
  uint uVar1;
  code *pcVar2;
  
  if (ignore_case == 0) {
    pcVar2 = strcmp;
  }
  else {
    pcVar2 = strcasecmp;
  }
  uVar1 = (*pcVar2)(*p1,*p2);
  if (uVar1 == 0) {
    if (*(ulong *)((long)p1 + 8) == *(ulong *)((long)p2 + 8)) {
      uVar1 = *(int *)((long)p1 + 0x10) - *(int *)((long)p2 + 0x10);
    }
    else {
      uVar1 = (*(ulong *)((long)p2 + 8) < *(ulong *)((long)p1 + 8)) - 1 | 1;
    }
  }
  return uVar1;
}

Assistant:

static int
entry_cmp(const void *p1, const void *p2) {
    const struct entry *e1, *e2;
    int c;

    e1 = (struct entry *)p1;
    e2 = (struct entry *)p2;

    if ((c = (ignore_case ? strcasecmp : strcmp)(e1->name, e2->name)) != 0)
	return c;
    if (e1->size != e2->size) {
	if (e1->size > e2->size)
	    return 1;
	else
	    return -1;
    }
    if (e1->crc != e2->crc)
	return (int)e1->crc - (int)e2->crc;

    return 0;
}